

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Int_t * Gia_SimRsbTfo(Gia_SimRsbMan_t *p,int iObj,int iFanout)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  int iVar3;
  int iVar4;
  int i;
  long lVar5;
  
  if (iObj < 1) {
    __assert_fail("iObj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x1b3,"Vec_Int_t *Gia_SimRsbTfo(Gia_SimRsbMan_t *, int, int)");
  }
  p->vTfo->nSize = 0;
  Gia_ManIncrementTravId(p->pGia);
  Gia_SimRsbTfo_rec(p->pGia,iObj,iFanout,p->vTfo);
  p_00 = p->vTfo;
  iVar3 = p_00->nSize;
  if (0 < (long)iVar3) {
    piVar2 = p_00->pArray;
    if (piVar2[(long)iVar3 + -1] == iObj) {
      iVar3 = iVar3 + -1;
      p_00->nSize = iVar3;
      iVar4 = -1;
      for (lVar5 = 0; lVar5 < iVar3 / 2; lVar5 = lVar5 + 1) {
        iVar1 = piVar2[lVar5];
        piVar2[lVar5] = piVar2[iVar3 + iVar4];
        piVar2[p_00->nSize + iVar4] = iVar1;
        iVar3 = p_00->nSize;
        iVar4 = iVar4 + -1;
      }
      Vec_IntSort(p_00,(int)piVar2);
      return p->vTfo;
    }
    __assert_fail("Vec_IntEntryLast(p->vTfo) == iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x1b7,"Vec_Int_t *Gia_SimRsbTfo(Gia_SimRsbMan_t *, int, int)");
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_SimRsbTfo( Gia_SimRsbMan_t * p, int iObj, int iFanout )
{
    assert( iObj > 0 );
    Vec_IntClear( p->vTfo );
    Gia_ManIncrementTravId( p->pGia );
    Gia_SimRsbTfo_rec( p->pGia, iObj, iFanout, p->vTfo );
    assert( Vec_IntEntryLast(p->vTfo) == iObj );
    Vec_IntPop( p->vTfo );
    Vec_IntReverseOrder( p->vTfo );
    Vec_IntSort( p->vTfo, 0 );
    return p->vTfo;
}